

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O0

RSA * SRUP_Crypto::getPubKeyF(char *keyfile)

{
  FILE *fp_00;
  FILE *fp;
  RSA *key;
  char *keyfile_local;
  
  key = (RSA *)keyfile;
  fp_00 = fopen(keyfile,"rb");
  if (fp_00 == (FILE *)0x0) {
    keyfile_local = (char *)0x0;
  }
  else {
    fp = (FILE *)RSA_new();
    fp = (FILE *)PEM_read_RSA_PUBKEY(fp_00,(RSA **)&fp,(undefined1 *)0x0,(void *)0x0);
    fclose(fp_00);
    keyfile_local = (char *)fp;
  }
  return (RSA *)keyfile_local;
}

Assistant:

RSA* SRUP_Crypto::getPubKeyF(char *keyfile)
{
    RSA *key;
    FILE *fp = fopen(keyfile, "rb");
    if (!fp)
        return nullptr;
    else
    {
        key = RSA_new();
        key = PEM_read_RSA_PUBKEY(fp, &key, nullptr, nullptr);
        fclose(fp);
        return key;
    }
}